

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromAPInt
          (IEEEFloat *this,APInt *Val,bool isSigned,roundingMode rounding_mode)

{
  bool bVar1;
  opStatus oVar2;
  ulong uVar3;
  anon_union_8_2_1313ab2f_for_U src;
  APInt api;
  anon_union_8_2_1313ab2f_for_U local_60;
  uint local_58;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  local_58 = Val->BitWidth;
  uVar3 = (ulong)local_58;
  if (uVar3 < 0x41) {
    local_60 = (anon_union_8_2_1313ab2f_for_U)(Val->U).pVal;
  }
  else {
    APInt::initSlowCase((APInt *)&local_60,Val);
  }
  this->field_0x12 = this->field_0x12 & 0xf7;
  if ((isSigned) && (bVar1 = APInt::operator[]((APInt *)&local_60,local_58 - 1), bVar1)) {
    this->field_0x12 = this->field_0x12 | 8;
    local_48 = local_58;
    if (local_58 < 0x41) {
      local_50.VAL = local_60.VAL;
    }
    else {
      APInt::initSlowCase((APInt *)&local_50,(APInt *)&local_60);
    }
    APInt::flipAllBits((APInt *)&local_50);
    APInt::operator++((APInt *)&local_50);
    local_38 = local_48;
    local_40.VAL = local_50.VAL;
    local_48 = 0;
    APInt::operator=((APInt *)&local_60,(APInt *)&local_40);
    if ((0x40 < local_38) &&
       ((anon_union_8_2_1313ab2f_for_U *)local_40.VAL != (anon_union_8_2_1313ab2f_for_U *)0x0)) {
      operator_delete__(local_40.pVal);
    }
    if ((0x40 < local_48) &&
       ((anon_union_8_2_1313ab2f_for_U *)local_50.VAL != (anon_union_8_2_1313ab2f_for_U *)0x0)) {
      operator_delete__(local_50.pVal);
    }
  }
  src = local_60;
  if (local_58 < 0x41) {
    src.pVal = (uint64_t *)&local_60;
  }
  oVar2 = convertFromUnsignedParts(this,src.pVal,(uint)(uVar3 + 0x3f >> 6),rounding_mode);
  if ((0x40 < local_58) &&
     ((anon_union_8_2_1313ab2f_for_U *)local_60.VAL != (anon_union_8_2_1313ab2f_for_U *)0x0)) {
    operator_delete__(local_60.pVal);
  }
  return oVar2;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::convertFromAPInt(const APInt &Val, bool isSigned,
                                                roundingMode rounding_mode) {
  unsigned int partCount = Val.getNumWords();
  APInt api = Val;

  sign = false;
  if (isSigned && api.isNegative()) {
    sign = true;
    api = -api;
  }

  return convertFromUnsignedParts(api.getRawData(), partCount, rounding_mode);
}